

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cpp
# Opt level: O1

PyObject * PyInit_example(void)

{
  PyObject *pPVar1;
  
  if (PyInit_example::moduledef == '\0') {
    PyInit_example_cold_1();
  }
  pPVar1 = (PyObject *)
           boost::python::detail::init_module(&PyInit_example::moduledef,init_module_example);
  return pPVar1;
}

Assistant:

BOOST_PYTHON_MODULE(example)
{
  namespace python = boost::python;
  python::class_<ExampleClass>("ExampleClass")
    .def("print", &ExampleClass::print_state)
    .def("exporter", &example_class_export_wrap)
    .def("set_data", &ExampleClass::set_data)
    .def("importer", &example_class_import_wrap)
    ;
}